

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O2

sunrealtype MaxError(N_Vector y,sunrealtype t)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_30 = 0.0;
  if ((t != 0.0) || (NAN(t))) {
    lVar1 = N_VGetArrayPointer();
    local_30 = 0.0;
    local_28 = 0.0;
    if (t <= 30.0) {
      local_28 = exp(t * -2.0);
    }
    lVar2 = 0;
    local_38 = 1.0;
    while (lVar2 != 5) {
      lVar3 = 0;
      dVar5 = 1.0;
      while (lVar3 != 5) {
        dVar4 = pow(t,(double)(lVar2 + lVar3));
        dVar4 = ABS(*(double *)(lVar1 + lVar3 * 8) - dVar4 * local_28 * dVar5 * local_38);
        if (dVar4 <= local_30) {
          dVar4 = local_30;
        }
        lVar3 = lVar3 + 1;
        dVar5 = dVar5 / (double)lVar3;
        local_30 = dVar4;
      }
      lVar2 = lVar2 + 1;
      local_38 = local_38 / (double)lVar2;
      lVar1 = lVar1 + 0x28;
    }
  }
  return local_30;
}

Assistant:

static sunrealtype MaxError(N_Vector y, sunrealtype t)
{
  sunindextype i, j, k;
  sunrealtype *ydata, er, ex = ZERO, yt, maxError = ZERO, ifact_inv,
                          jfact_inv = ONE;

  if (t == ZERO) { return (ZERO); }

  ydata = N_VGetArrayPointer(y);
  if (t <= THIRTY) { ex = exp(-TWO * t); }

  for (j = 0; j < P2_MESHY; j++)
  {
    ifact_inv = ONE;
    for (i = 0; i < P2_MESHX; i++)
    {
      k  = i + j * P2_MESHX;
      yt = pow(t, i + j) * ex * ifact_inv * jfact_inv;
      er = fabs(ydata[k] - yt);
      if (er > maxError) { maxError = er; }
      ifact_inv /= (i + 1);
    }
    jfact_inv /= (j + 1);
  }
  return (maxError);
}